

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

bool __thiscall M7Getter::AddAlgoFrequencies(M7Getter *this,TldDSAsKey *key)

{
  size_t sVar1;
  pointer pp_Var2;
  _st_m7_algo_count_t *p_Var3;
  ulong uVar4;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  m7_algo_count_t *algo_val;
  
  sVar1 = key->name_len;
  uVar4 = (ulong)key->algo_nb;
  dVar7 = 0.0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dVar7 = dVar7 + (double)key->algo_count[uVar5];
  }
  uVar5 = 0;
  do {
    if (uVar4 <= uVar5) {
      return true;
    }
    dVar8 = (double)key->algo_count[uVar5] / dVar7;
    pp_Var2 = (this->algo_count).
              super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      if ((long)(this->algo_count).
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var2 >> 3 == lVar6) {
        algo_val = (m7_algo_count_t *)operator_new(0x18);
        algo_val->algo_code = key->algo_code[uVar5];
        algo_val->algo_frequency = dVar8;
        if (sVar1 != 2) {
          dVar8 = 0.0;
        }
        algo_val->algo_frequency_cc = dVar8;
        std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::push_back
                  (&this->algo_count,&algo_val);
        uVar4 = (ulong)key->algo_nb;
        goto LAB_001a0b96;
      }
      p_Var3 = pp_Var2[lVar6];
      lVar6 = lVar6 + 1;
    } while (p_Var3->algo_code != key->algo_code[uVar5]);
    p_Var3->algo_frequency = p_Var3->algo_frequency + dVar8;
    if (sVar1 == 2) {
      p_Var3->algo_frequency_cc = dVar8 + p_Var3->algo_frequency_cc;
    }
LAB_001a0b96:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool M7Getter::AddAlgoFrequencies(TldDSAsKey* key)
{
    bool ret = true;
    double total = 0;
    bool is_cc = (key->name_len == 2);

    for (uint32_t i = 0; i < key->algo_nb; i++) {
        total += key->algo_count[i];
    }
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool found = false;
        double frequency = ((double)key->algo_count[i]) / total;
        for (size_t j = 0; j < algo_count.size(); j++) {
            if (algo_count[j]->algo_code == key->algo_code[i]) {
                algo_count[j]->algo_frequency += frequency;
                if (is_cc) {
                    algo_count[j]->algo_frequency_cc += frequency;
                }
                found = true;
                break;
            }
        }
        if (!found) {
            m7_algo_count_t * algo_val = new m7_algo_count_t;
                
            algo_val->algo_code = key->algo_code[i];
            algo_val->algo_frequency = frequency;
            algo_val->algo_frequency_cc = (is_cc) ? frequency : 0.0;
            this->algo_count.push_back(algo_val);
        }
    }

    return ret;
}